

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ds_list.c
# Opt level: O0

void test_list_insert(void)

{
  int iVar1;
  UNITY_INT UVar2;
  int local_3c;
  int i_1;
  int index;
  int i;
  char *str;
  char *strs [3];
  DS_STATUS status;
  
  UVar2 = ds_list_size(list);
  UnityAssertEqualNumber(UVar2,0,(char *)0x0,0x35,UNITY_DISPLAY_STYLE_INT);
  str = "a";
  strs[0] = "b";
  strs[1] = "c";
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    strs[2]._4_4_ = ds_list_append(list,strs[(long)i_1 + -1]);
    UVar2 = ds_list_size(list);
    UnityAssertEqualNumber(UVar2,(long)(i_1 + 1),(char *)0x0,0x3e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber((ulong)strs[2]._4_4_,0,(char *)0x0,0x3f,UNITY_DISPLAY_STYLE_INT);
  }
  iVar1 = ds_list_find_index(list,"c");
  UnityAssertEqualNumber((long)iVar1,2,(char *)0x0,0x43,UNITY_DISPLAY_STYLE_INT);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    strs[2]._4_4_ = ds_list_get(list,local_3c,&index);
    UnityAssertEqualNumber((ulong)strs[2]._4_4_,0,(char *)0x0,0x48,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualString(_index,strs[(long)local_3c + -1],(char *)0x0,0x49);
  }
  strs[2]._4_4_ = ds_list_prepend(list,"first");
  UnityAssertEqualNumber((ulong)strs[2]._4_4_,0,(char *)0x0,0x4d,UNITY_DISPLAY_STYLE_INT);
  strs[2]._4_4_ = ds_list_insert(list,4,"last");
  UnityAssertEqualNumber((ulong)strs[2]._4_4_,0,(char *)0x0,0x50,UNITY_DISPLAY_STYLE_INT);
  UVar2 = ds_list_size(list);
  UnityAssertEqualNumber(UVar2,5,(char *)0x0,0x51,UNITY_DISPLAY_STYLE_INT);
  strs[2]._4_4_ = ds_list_insert(list,100,"outmem");
  UnityAssertEqualNumber((ulong)strs[2]._4_4_,2,(char *)0x0,0x54,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_list_insert(void)
{
    TEST_ASSERT_EQUAL(ds_list_size(list), 0);

    DS_STATUS status;
    char *strs[3] = {"a", "b", "c"};
    char *str;

    for (int i = 0; i < 3; ++i)
    {
        status = ds_list_append(list, strs[i]);
        TEST_ASSERT_EQUAL(ds_list_size(list), i + 1);
        TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
    }

    int index = ds_list_find_index(list, "c");
    TEST_ASSERT_EQUAL(index, 2);

    for (int i = 0; i < 3; ++i)
    {
        status = ds_list_get(list, i, (void **)&str);
        TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
        TEST_ASSERT_EQUAL_STRING(str, strs[i]);
    }

    status = ds_list_prepend(list, "first");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OK);

    status = ds_list_insert(list, 4, "last");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
    TEST_ASSERT_EQUAL(ds_list_size(list), 5);

    status = ds_list_insert(list, 100, "outmem");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OUTMEM);
}